

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedMap.c
# Opt level: O0

void rmlLinkedMapDestroy(void *self)

{
  int64_t iVar1;
  rmlLinkedMapKeyValuePair_ *self_00;
  rmlLinkedMapKeyValuePair_ *pair;
  void *self_local;
  
  if (self != (void *)0x0) {
    while (iVar1 = rmlLinkedListGetLength(self), 0 < iVar1) {
      self_00 = (rmlLinkedMapKeyValuePair_ *)rmlLinkedListPop(self);
      rmlLinkedMapKeyValuePairDestroy(self_00);
    }
    rmlLinkedListDestroy(self);
  }
  return;
}

Assistant:

void rmlLinkedMapDestroy(void *self) {
    if (self == NULL) {
        return;
    }

    while (rmlLinkedListGetLength(self) > 0) {
        struct rmlLinkedMapKeyValuePair_ *pair = rmlLinkedListPop(self);
        rmlLinkedMapKeyValuePairDestroy(pair);
    }

    RML_VERBOSE("Destroy LinkedMap(0x%llx), also destroy the related LinkedList", (uint64_t) self)
    rmlLinkedListDestroy(self);
}